

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

void __thiscall
optTyped_defaultConstructorConstRvalue_Test<mp::opt<long,_mp::opt_null_value_policy<long,_-1L>_>_>::
~optTyped_defaultConstructorConstRvalue_Test
          (optTyped_defaultConstructorConstRvalue_Test<mp::opt<long,_mp::opt_null_value_policy<long,__1L>_>_>
           *this)

{
  optTyped_defaultConstructorConstRvalue_Test<mp::opt<long,_mp::opt_null_value_policy<long,__1L>_>_>
  *this_local;
  
  ~optTyped_defaultConstructorConstRvalue_Test(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

TYPED_TEST(optTyped, defaultConstructorConstRvalue)
{
  using opt_type = typename TestFixture::type;
  auto make = []() -> const opt_type { return opt_type{}; };
  EXPECT_FALSE(make());
  EXPECT_FALSE(make().has_value());
  EXPECT_THROW(make().value(), bad_optional_access);
  EXPECT_EQ(this->value_2, make().value_or(this->value_2));
}